

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

MaybeResult<wasm::Ok> *
wasm::WATParser::locals<wasm::WATParser::ParseDeclsCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx)

{
  __index_type *p_Var1;
  size_t sVar2;
  char *pcVar3;
  ParseDeclsCtx *pPVar4;
  bool bVar5;
  Name *pNVar6;
  basic_string_view<char,_std::char_traits<char>_> expected;
  Name local_1c8;
  Err local_1b8;
  Err *local_198;
  Err *err_1;
  Result<wasm::Ok> _val_1;
  Result<wasm::Ok> type_1;
  allocator<char> local_119;
  string local_118;
  Err local_f8;
  uint local_d4;
  Err local_d0;
  Err *local_b0;
  Err *err;
  undefined1 local_98 [8];
  Result<wasm::Ok> _val;
  Result<wasm::Ok> type;
  optional<wasm::Name> id;
  Ok local_1a;
  byte local_19;
  LocalsT res;
  ParseDeclsCtx *pPStack_18;
  bool hasAny;
  ParseDeclsCtx *ctx_local;
  
  local_19 = 0;
  pPStack_18 = ctx;
  NullTypeParserCtx::makeLocals((NullTypeParserCtx *)ctx);
  do {
    while( true ) {
      pPVar4 = pPStack_18;
      expected = sv("local",5);
      bVar5 = Lexer::takeSExprStart(&pPVar4->in,expected);
      if (!bVar5) {
        if ((local_19 & 1) != 0) {
          MaybeResult<wasm::Ok>::MaybeResult<wasm::Ok>(__return_storage_ptr__,&local_1a);
          return __return_storage_ptr__;
        }
        MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__);
        return __return_storage_ptr__;
      }
      local_19 = 1;
      Lexer::takeID((optional<wasm::Name> *)
                    ((long)&type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),&pPStack_18->in);
      bVar5 = std::optional::operator_cast_to_bool
                        ((optional *)
                         ((long)&type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      if (bVar5) break;
      while (bVar5 = Lexer::takeRParen(&pPStack_18->in), ((bVar5 ^ 0xffU) & 1) != 0) {
        p_Var1 = (__index_type *)
                 ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
        valtype<wasm::WATParser::ParseDeclsCtx>((Result<wasm::Ok> *)p_Var1,pPStack_18);
        Result<wasm::Ok>::Result((Result<wasm::Ok> *)&err_1,(Result<wasm::Ok> *)p_Var1);
        local_198 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_1);
        bVar5 = local_198 != (Err *)0x0;
        if (bVar5) {
          wasm::Err::Err(&local_1b8,local_198);
          MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_1b8);
          wasm::Err::~Err(&local_1b8);
        }
        local_d4 = (uint)bVar5;
        Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_1);
        pPVar4 = pPStack_18;
        if (local_d4 == 0) {
          wasm::Name::Name(&local_1c8);
          Result<wasm::Ok>::operator*
                    ((Result<wasm::Ok> *)
                     ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
          NullTypeParserCtx::appendLocal
                    ((NullTypeParserCtx *)pPVar4,&local_1a,local_1c8.super_IString.str._M_len,
                     local_1c8.super_IString.str._M_str);
          local_d4 = 0;
        }
        Result<wasm::Ok>::~Result
                  ((Result<wasm::Ok> *)
                   ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
        if (local_d4 != 0) {
          return __return_storage_ptr__;
        }
      }
    }
    p_Var1 = (__index_type *)
             ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
    valtype<wasm::WATParser::ParseDeclsCtx>((Result<wasm::Ok> *)p_Var1,pPStack_18);
    Result<wasm::Ok>::Result((Result<wasm::Ok> *)local_98,(Result<wasm::Ok> *)p_Var1);
    local_b0 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_98);
    bVar5 = local_b0 != (Err *)0x0;
    if (bVar5) {
      wasm::Err::Err(&local_d0,local_b0);
      MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_d0);
      wasm::Err::~Err(&local_d0);
    }
    local_d4 = (uint)bVar5;
    Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_98);
    if (local_d4 == 0) {
      bVar5 = Lexer::takeRParen(&pPStack_18->in);
      pPVar4 = pPStack_18;
      if (bVar5) {
        pNVar6 = std::optional<wasm::Name>::operator*
                           ((optional<wasm::Name> *)
                            ((long)&type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
        sVar2 = (pNVar6->super_IString).str._M_len;
        pcVar3 = (pNVar6->super_IString).str._M_str;
        Result<wasm::Ok>::operator*
                  ((Result<wasm::Ok> *)
                   ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
        NullTypeParserCtx::appendLocal((NullTypeParserCtx *)pPVar4,&local_1a,sVar2,pcVar3);
        local_d4 = 0;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_118,"expected end of local",&local_119);
        Lexer::err(&local_f8,&pPVar4->in,&local_118);
        MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_f8);
        wasm::Err::~Err(&local_f8);
        std::__cxx11::string::~string((string *)&local_118);
        std::allocator<char>::~allocator(&local_119);
        local_d4 = 1;
      }
    }
    Result<wasm::Ok>::~Result
              ((Result<wasm::Ok> *)
               ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
  } while (local_d4 == 0);
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<typename Ctx::LocalsT> locals(Ctx& ctx) {
  bool hasAny = false;
  auto res = ctx.makeLocals();
  while (ctx.in.takeSExprStart("local"sv)) {
    hasAny = true;
    if (auto id = ctx.in.takeID()) {
      // Single named local
      auto type = valtype(ctx);
      CHECK_ERR(type);
      if (!ctx.in.takeRParen()) {
        return ctx.in.err("expected end of local");
      }
      ctx.appendLocal(res, *id, *type);
    } else {
      // Repeated unnamed locals
      while (!ctx.in.takeRParen()) {
        auto type = valtype(ctx);
        CHECK_ERR(type);
        ctx.appendLocal(res, {}, *type);
      }
    }
  }
  if (hasAny) {
    return res;
  }
  return {};
}